

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

bool __thiscall cmFileAPI::ReadJsonFile(cmFileAPI *this,string *file,Value *value,string *error)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  uint uVar4;
  long lVar5;
  streamoff sVar6;
  char *pcVar7;
  pointer pCVar8;
  char *pcVar9;
  size_type sVar10;
  undefined1 auVar11 [16];
  Value local_2d0;
  undefined4 local_2a4;
  Value local_2a0;
  size_type local_278;
  size_t finSize;
  pos_type finEnd;
  long local_250;
  ifstream fin;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> content;
  string *error_local;
  Value *value_local;
  string *file_local;
  cmFileAPI *this_local;
  
  content.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = error;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_48);
  std::ifstream::ifstream(&local_250);
  bVar1 = cmsys::SystemTools::FileIsDirectory(file);
  if (!bVar1) {
    _Var3 = std::__cxx11::string::c_str();
    std::ifstream::open((char *)&local_250,_Var3);
  }
  lVar5 = std::ifstream::rdbuf();
  std::operator|(_S_in,_S_out);
  auVar11 = std::streambuf::pubseekoff(lVar5,_S_beg,_S_ate);
  finEnd._M_off = auVar11._8_8_;
  finSize = auVar11._0_8_;
  sVar6 = std::fpos::operator_cast_to_long((fpos *)&finSize);
  if (0 < sVar6) {
    local_278 = std::fpos::operator_cast_to_long((fpos *)&finSize);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_48,local_278);
    std::istream::seekg((long)&local_250,_S_beg);
    pcVar7 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_48);
    std::istream::read((char *)&local_250,(long)pcVar7);
  }
  std::ifstream::close();
  bVar2 = std::ios::operator!((ios *)((long)&local_250 + *(long *)(local_250 + -0x18)));
  if ((bVar2 & 1) == 0) {
    pCVar8 = std::unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_>::operator->
                       (&this->JsonReader);
    pcVar7 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_48);
    pcVar9 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_48);
    sVar10 = std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)local_48);
    uVar4 = (*pCVar8->_vptr_CharReader[2])
                      (pCVar8,pcVar7,pcVar9 + sVar10,value,
                       content.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
    if ((uVar4 & 1) == 0) {
      Json::Value::Value(&local_2d0,nullValue);
      Json::Value::operator=(value,&local_2d0);
      Json::Value::~Value(&local_2d0);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    Json::Value::Value(&local_2a0,nullValue);
    Json::Value::operator=(value,&local_2a0);
    Json::Value::~Value(&local_2a0);
    std::__cxx11::string::operator=
              ((string *)content.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
               "failed to read from file");
    this_local._7_1_ = false;
  }
  local_2a4 = 1;
  std::ifstream::~ifstream(&local_250);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_48)
  ;
  return this_local._7_1_;
}

Assistant:

bool cmFileAPI::ReadJsonFile(std::string const& file, Json::Value& value,
                             std::string& error)
{
  std::vector<char> content;

  cmsys::ifstream fin;
  if (!cmSystemTools::FileIsDirectory(file)) {
    fin.open(file.c_str(), std::ios::binary);
  }
  auto finEnd = fin.rdbuf()->pubseekoff(0, std::ios::end);
  if (finEnd > 0) {
    size_t finSize = finEnd;
    try {
      // Allocate a buffer to read the whole file.
      content.resize(finSize);

      // Now read the file from the beginning.
      fin.seekg(0, std::ios::beg);
      fin.read(content.data(), finSize);
    } catch (...) {
      fin.setstate(std::ios::failbit);
    }
  }
  fin.close();
  if (!fin) {
    value = Json::Value();
    error = "failed to read from file";
    return false;
  }

  // Parse our buffer as json.
  if (!this->JsonReader->parse(content.data(), content.data() + content.size(),
                               &value, &error)) {
    value = Json::Value();
    return false;
  }

  return true;
}